

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint64_t fletcher4(char *key,int len,uint64_t seed)

{
  uint8_t *endc;
  uint8_t *datac;
  uint64_t D;
  uint64_t C;
  uint64_t B;
  uint64_t A;
  uint32_t *endw;
  uint32_t *dataw;
  uint64_t seed_local;
  int len_local;
  char *key_local;
  
  B = 0;
  C = 0;
  D = 0;
  A = seed;
  for (dataw = (uint32_t *)key; dataw < key + (long)(len / 4) * 4; dataw = dataw + 1) {
    A = *dataw + A;
    B = A + B;
    C = B + C;
    D = C + D;
  }
  if ((len & 3U) != 0) {
    for (datac = (uint8_t *)dataw; datac < key + len; datac = datac + 1) {
      A = *datac + A;
      B = A + B;
      C = B + C;
      D = C + D;
    }
  }
  return D;
}

Assistant:

uint64_t
fletcher4(const char *key, int len, uint64_t seed)
{
  uint32_t *dataw = (uint32_t *)key;
  const uint32_t *const endw = &((const uint32_t*)key)[len/4];
  uint64_t A = seed, B = 0, C = 0, D = 0;
  while (dataw < endw) {
    A += *dataw++;
    B += A;
    C += B;
    D += C;
  }
  if (len & 3) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (datac < endc) {
      A += *datac++;
      B += A;
      C += B;
      D += C;
    }
  }
  return D;
}